

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

Gia_Man_t *
Gia_ManBmcUnroll(Gia_Man_t *pGia,int nFramesMax,int nFramesAdd,int fVerbose,Vec_Int_t **pvPiMap)

{
  uint *puVar1;
  uint *p;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  char *pcVar9;
  Gia_Obj_t *pObj_00;
  bool bVar10;
  uint *local_d0;
  uint *local_98;
  int local_8c;
  int local_88;
  int iFirst;
  int i;
  int f;
  uint *pStateP;
  uint *pStateF;
  Vec_Int_t *vMap;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCone;
  Vec_Int_t *vRoots;
  Vec_Ptr_t *vBegins;
  Vec_Ptr_t *vStates;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Obj_t *pObj;
  Vec_Int_t **pvPiMap_local;
  int local_18;
  int fVerbose_local;
  int nFramesAdd_local;
  int nFramesMax_local;
  Gia_Man_t *pGia_local;
  
  pObj = (Gia_Obj_t *)pvPiMap;
  pvPiMap_local._4_4_ = fVerbose;
  local_18 = nFramesAdd;
  fVerbose_local = nFramesMax;
  _nFramesAdd_local = pGia;
  Gia_ManCleanPhase(pGia);
  vLeaves = Vec_IntAlloc(1000);
  vMap = Vec_IntAlloc(1000);
  vBegins = Bmc_MnaTernary(_nFramesAdd_local,fVerbose_local,local_18,pvPiMap_local._4_4_,&local_8c);
  pVVar8 = Vec_IntAlloc(1000);
  *(Vec_Int_t **)pObj = pVVar8;
  iVar3 = Vec_PtrSize(vBegins);
  vRoots = (Vec_Int_t *)Vec_PtrStart(iVar3);
  iFirst = Vec_PtrSize(vBegins);
  do {
    iFirst = iFirst + -1;
    if (iFirst < 0) break;
    pStateP = (uint *)Vec_PtrEntry(vBegins,iFirst);
    if (iFirst == 0) {
      local_98 = (uint *)0x0;
    }
    else {
      local_98 = (uint *)Vec_PtrEntry(vBegins,iFirst + -1);
    }
    _i = local_98;
    vCone = Vec_IntAlloc(100);
    local_88 = 0;
    while( true ) {
      iVar3 = local_88;
      iVar4 = Gia_ManPoNum(_nFramesAdd_local);
      bVar10 = false;
      if (iVar3 < iVar4) {
        pNew = (Gia_Man_t *)Gia_ManCo(_nFramesAdd_local,local_88);
        bVar10 = pNew != (Gia_Man_t *)0x0;
      }
      puVar1 = pStateP;
      if (!bVar10) break;
      iVar3 = Gia_ObjCioId((Gia_Obj_t *)pNew);
      iVar3 = Gia_ManTerSimInfoGet(puVar1,iVar3);
      pVVar8 = vCone;
      if (iVar3 == 3) {
        iVar3 = Gia_ObjId(_nFramesAdd_local,(Gia_Obj_t *)pNew);
        Vec_IntPush(pVVar8,iVar3);
      }
      local_88 = local_88 + 1;
    }
    Vec_IntAppend(vCone,vMap);
    Vec_PtrWriteEntry((Vec_Ptr_t *)vRoots,iFirst,vCone);
    Bmc_MnaCollect(_nFramesAdd_local,vCone,vLeaves,_i);
    Bmc_MnaSelect(_nFramesAdd_local,vCone,vLeaves,vMap);
    iVar3 = iFirst;
    if (pvPiMap_local._4_4_ != 0) {
      uVar5 = Vec_IntSize(vCone);
      uVar6 = Vec_IntSize(vMap);
      uVar7 = Vec_IntSize(vLeaves);
      printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",(ulong)(uint)iVar3,(ulong)uVar5,
             (ulong)uVar6,(ulong)uVar7);
    }
    iVar3 = Vec_IntSize(vMap);
  } while (iVar3 != 0);
  if (iFirst < 0) {
    __assert_fail("f >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                  ,0x143,"Gia_Man_t *Gia_ManBmcUnroll(Gia_Man_t *, int, int, int, Vec_Int_t **)");
  }
  iVar3 = Gia_ManObjNum(_nFramesAdd_local);
  pStateF = (uint *)Vec_IntStartFull(iVar3);
  pTemp = Gia_ManStart(10000);
  pcVar9 = Abc_UtilStrsav(_nFramesAdd_local->pName);
  pTemp->pName = pcVar9;
  Gia_ManHashStart(pTemp);
  for (iFirst = 0; iVar3 = iFirst, iVar4 = Vec_PtrSize(vBegins), iVar3 < iVar4; iFirst = iFirst + 1)
  {
    vCone = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vRoots,iFirst);
    if (vCone == (Vec_Int_t *)0x0) {
      local_88 = 0;
      while( true ) {
        iVar3 = local_88;
        iVar4 = Gia_ManPoNum(_nFramesAdd_local);
        bVar10 = false;
        if (iVar3 < iVar4) {
          pNew = (Gia_Man_t *)Gia_ManCo(_nFramesAdd_local,local_88);
          bVar10 = pNew != (Gia_Man_t *)0x0;
        }
        if (!bVar10) break;
        Gia_ManAppendCo(pTemp,0);
        local_88 = local_88 + 1;
      }
    }
    else {
      pStateP = (uint *)Vec_PtrEntry(vBegins,iFirst);
      if (iFirst == 0) {
        local_d0 = (uint *)0x0;
      }
      else {
        local_d0 = (uint *)Vec_PtrEntry(vBegins,iFirst + -1);
      }
      _i = local_d0;
      local_88 = 0;
      while( true ) {
        iVar3 = local_88;
        iVar4 = Gia_ManPoNum(_nFramesAdd_local);
        bVar10 = false;
        if (iVar3 < iVar4) {
          pNew = (Gia_Man_t *)Gia_ManCo(_nFramesAdd_local,local_88);
          bVar10 = pNew != (Gia_Man_t *)0x0;
        }
        puVar1 = pStateF;
        if (!bVar10) break;
        iVar3 = Gia_ObjId(_nFramesAdd_local,(Gia_Obj_t *)pNew);
        Vec_IntWriteEntry((Vec_Int_t *)puVar1,iVar3,0);
        local_88 = local_88 + 1;
      }
      Vec_IntPush(*(Vec_Int_t **)pObj,-1 - iFirst);
      Bmc_MnaCollect(_nFramesAdd_local,vCone,vLeaves,_i);
      Bmc_MnaBuild(_nFramesAdd_local,vCone,vLeaves,pTemp,(Vec_Int_t *)pStateF,*(Vec_Int_t **)pObj);
      iVar3 = iFirst;
      if (pvPiMap_local._4_4_ != 0) {
        uVar5 = Vec_IntSize(vCone);
        uVar6 = Vec_IntSize(vMap);
        uVar7 = Vec_IntSize(vLeaves);
        printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",(ulong)(uint)iVar3,
               (ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
      }
      local_88 = 0;
      while( true ) {
        iVar3 = local_88;
        iVar4 = Gia_ManPoNum(_nFramesAdd_local);
        bVar10 = false;
        if (iVar3 < iVar4) {
          pNew = (Gia_Man_t *)Gia_ManCo(_nFramesAdd_local,local_88);
          bVar10 = pNew != (Gia_Man_t *)0x0;
        }
        pGVar2 = pTemp;
        puVar1 = pStateF;
        if (!bVar10) break;
        iVar3 = Gia_ObjId(_nFramesAdd_local,(Gia_Obj_t *)pNew);
        iVar3 = Vec_IntEntry((Vec_Int_t *)puVar1,iVar3);
        Gia_ManAppendCo(pGVar2,iVar3);
        local_88 = local_88 + 1;
      }
      local_88 = 0;
      while( true ) {
        iVar3 = local_88;
        iVar4 = Vec_IntSize(vCone);
        pGVar2 = _nFramesAdd_local;
        bVar10 = false;
        if (iVar3 < iVar4) {
          iVar3 = Vec_IntEntry(vCone,local_88);
          pNew = (Gia_Man_t *)Gia_ManObj(pGVar2,iVar3);
          bVar10 = pNew != (Gia_Man_t *)0x0;
        }
        if (!bVar10) break;
        iVar3 = Gia_ObjIsRi(_nFramesAdd_local,(Gia_Obj_t *)pNew);
        pGVar2 = _nFramesAdd_local;
        puVar1 = pStateF;
        if (iVar3 != 0) {
          pObj_00 = Gia_ObjRiToRo(_nFramesAdd_local,(Gia_Obj_t *)pNew);
          iVar3 = Gia_ObjId(pGVar2,pObj_00);
          p = pStateF;
          iVar4 = Gia_ObjId(_nFramesAdd_local,(Gia_Obj_t *)pNew);
          iVar4 = Vec_IntEntry((Vec_Int_t *)p,iVar4);
          Vec_IntWriteEntry((Vec_Int_t *)puVar1,iVar3,iVar4);
        }
        local_88 = local_88 + 1;
      }
    }
  }
  Gia_ManHashStop(pTemp);
  Vec_VecFree((Vec_Vec_t *)vRoots);
  Vec_PtrFreeFree(vBegins);
  Vec_IntFree(vMap);
  Vec_IntFree(vLeaves);
  Vec_IntFree((Vec_Int_t *)pStateF);
  vStates = (Vec_Ptr_t *)pTemp;
  pTemp = Gia_ManCleanup(pTemp);
  Gia_ManStop((Gia_Man_t *)vStates);
  return pTemp;
}

Assistant:

Gia_Man_t * Gia_ManBmcUnroll( Gia_Man_t * pGia, int nFramesMax, int nFramesAdd, int fVerbose, Vec_Int_t ** pvPiMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Ptr_t * vStates, * vBegins;
    Vec_Int_t * vRoots, * vCone, * vLeaves, * vMap;
    unsigned * pStateF, * pStateP;
    int f, i, iFirst;
    Gia_ManCleanPhase( pGia );
    vCone = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    // perform ternary simulation
    vStates = Bmc_MnaTernary( pGia, nFramesMax, nFramesAdd, fVerbose, &iFirst );
    // go backward
    *pvPiMap = Vec_IntAlloc( 1000 );
    vBegins = Vec_PtrStart( Vec_PtrSize(vStates) );
    for ( f = Vec_PtrSize(vStates) - 1; f >= 0; f-- )
    {
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // collect roots of this frame
        vRoots = Vec_IntAlloc( 100 );
        Gia_ManForEachPo( pGia, pObj, i )
            if ( Gia_ManTerSimInfoGet( pStateF, Gia_ObjCioId(pObj) ) == GIA_UND )
                Vec_IntPush( vRoots, Gia_ObjId(pGia, pObj) );
        // add leaves from the previous frame
        Vec_IntAppend( vRoots, vLeaves );
        Vec_PtrWriteEntry( vBegins, f, vRoots );
        // find the cone
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP ); // computes vCone
        Bmc_MnaSelect( pGia, vRoots, vCone, vLeaves );  // computes vLeaves 
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        if ( Vec_IntSize(vLeaves) == 0 )
            break;
        // it is possible that some of the POs are still ternary... 
    }
    assert( f >= 0 );
    // go forward
    vMap = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( pNew );
    for ( f = 0; f < Vec_PtrSize(vStates); f++ )
    {
        vRoots = (Vec_Int_t *)Vec_PtrEntry( vBegins, f );
        if ( vRoots == NULL )
        {
            Gia_ManForEachPo( pGia, pObj, i )
                Gia_ManAppendCo( pNew, 0 );
            continue;
        }
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // clean POs
        Gia_ManForEachPo( pGia, pObj, i )
            Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pObj), 0 );
        // find the cone
        Vec_IntPush( *pvPiMap, -f-1 );
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP );   // computes vCone
        Bmc_MnaBuild( pGia, vRoots, vCone, pNew, vMap, *pvPiMap );  // computes pNew       
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        // create POs
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
        // set a new map
        Gia_ManForEachObjVec( vRoots, pGia, pObj, i )
            if ( Gia_ObjIsRi(pGia, pObj) )
                Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, Gia_ObjRiToRo(pGia, pObj)), Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else if ( Gia_ObjIsPo(pGia, pObj) )
//                Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    Vec_VecFree( (Vec_Vec_t *)vBegins );
    Vec_PtrFreeFree( vStates );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCone );
    Vec_IntFree( vMap );
    // cleanup
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}